

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

int tidySaveString(TidyDoc tdoc,tmbstr buffer,uint *buflen)

{
  uint nl;
  int iVar1;
  StreamOut *out;
  TidyBuffer outbuf;
  
  nl = tdoc[0x8e]._opaque;
  iVar1 = tdoc[0x94]._opaque;
  tidyBufInitWithAllocator(&outbuf,*(TidyAllocator **)(tdoc + 0xd18));
  out = prvTidyBufferOutput((TidyDocImpl *)tdoc,&outbuf,iVar1,nl);
  iVar1 = tidyDocSaveStream((TidyDocImpl *)tdoc,out);
  if (*buflen < outbuf.size) {
    iVar1 = -0xc;
  }
  else {
    memcpy(buffer,outbuf.bp,(ulong)outbuf.size);
  }
  *buflen = outbuf.size;
  tidyBufFree(&outbuf);
  (**(code **)(**(long **)(tdoc + 0xd18) + 0x10))(*(long **)(tdoc + 0xd18),out);
  return iVar1;
}

Assistant:

int TIDY_CALL        tidySaveString( TidyDoc tdoc, tmbstr buffer, uint* buflen )
{
    TidyDocImpl* doc = tidyDocToImpl( tdoc );
    return tidyDocSaveString( doc, buffer, buflen );
}